

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddMouseButtonEvent(ImGuiIO *this,int mouse_button,bool down)

{
  byte bVar1;
  ImGuiContext *pIVar2;
  ImGuiInputEvent *pIVar3;
  byte in_DL;
  int in_ESI;
  long in_RDI;
  ImGuiInputEvent e;
  bool latest_button_down;
  ImGuiInputEvent *latest_event;
  ImGuiContext *g;
  ImGuiInputEvent *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar4;
  int in_stack_ffffffffffffffc8;
  ImGuiInputEventType in_stack_ffffffffffffffcc;
  
  pIVar2 = GImGui;
  if ((*(byte *)(in_RDI + 0x37a1) & 1) != 0) {
    pIVar3 = FindLatestInputEvent(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    if (pIVar3 == (ImGuiInputEvent *)0x0) {
      bVar1 = (pIVar2->IO).MouseDown[in_ESI];
    }
    else {
      bVar1 = (pIVar3->field_2).MouseButton.Down;
    }
    uVar4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffc0);
    if ((bVar1 & 1) != (in_DL & 1)) {
      ImGuiInputEvent::ImGuiInputEvent((ImGuiInputEvent *)0x48faaf);
      ImVector<ImGuiInputEvent>::push_back
                ((ImVector<ImGuiInputEvent> *)CONCAT44(3,uVar4),in_stack_ffffffffffffffb8);
    }
  }
  return;
}

Assistant:

void ImGuiIO::AddMouseButtonEvent(int mouse_button, bool down)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    IM_ASSERT(mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT);
    if (!AppAcceptingEvents)
        return;

    // Filter duplicate
    const ImGuiInputEvent* latest_event = FindLatestInputEvent(ImGuiInputEventType_MouseButton, (int)mouse_button);
    const bool latest_button_down = latest_event ? latest_event->MouseButton.Down : g.IO.MouseDown[mouse_button];
    if (latest_button_down == down)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_MouseButton;
    e.Source = ImGuiInputSource_Mouse;
    e.MouseButton.Button = mouse_button;
    e.MouseButton.Down = down;
    g.InputEventsQueue.push_back(e);
}